

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedList.h
# Opt level: O1

void __thiscall LinkedList<Transaction_*>::insert(LinkedList<Transaction_*> *this,Transaction *data)

{
  Node<Transaction_*> *pNVar1;
  
  pNVar1 = (Node<Transaction_*> *)operator_new(0x10);
  pNVar1->data = (Transaction *)0x0;
  pNVar1->next = (Node<Transaction_*> *)0x0;
  pNVar1->data = data;
  pNVar1->next = (Node<Transaction_*> *)0x0;
  if (this->head == (Node<Transaction_*> *)0x0) {
    this->head = pNVar1;
  }
  else {
    this->tail->next = pNVar1;
  }
  this->tail = pNVar1;
  this->size = this->size + 1;
  return;
}

Assistant:

void LinkedList<T>::insert(T data)
{
    auto node = new Node<T>();
    node->data = data;
    node->next = nullptr;

    if(head != nullptr)
    {
        tail->next = node;
        tail = node;
    } else{
        head = node;
        tail = node;
    }
    size++;
}